

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O1

void av1_highbd_dr_prediction_z2_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  short sVar19;
  int min_base_x;
  int iVar20;
  undefined4 uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 in_ZMM3 [64];
  ushort uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  int local_7c;
  undefined1 (*local_70) [16];
  int min_base_x_1;
  int frac_bits_x_1;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  auVar32._0_2_ = (undefined2)dy;
  bVar6 = (byte)upsample_above;
  local_7c = bh;
  local_70 = (undefined1 (*) [16])dst;
  if (bw == 8) {
    iVar20 = -1 << (bVar6 & 0x1f);
    iVar8 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      if (0 < bh) {
        auVar52._0_2_ = (undefined2)iVar8;
        auVar52._2_2_ = auVar52._0_2_;
        auVar52._4_2_ = auVar52._0_2_;
        auVar52._6_2_ = auVar52._0_2_;
        auVar52._8_2_ = auVar52._0_2_;
        auVar52._10_2_ = auVar52._0_2_;
        auVar52._12_2_ = auVar52._0_2_;
        auVar52._14_2_ = auVar52._0_2_;
        auVar29._2_2_ = auVar32._0_2_;
        auVar29._0_2_ = auVar32._0_2_;
        auVar29._4_2_ = auVar32._0_2_;
        auVar29._6_2_ = auVar32._0_2_;
        auVar29._8_2_ = auVar32._0_2_;
        auVar29._10_2_ = auVar32._0_2_;
        auVar29._12_2_ = auVar32._0_2_;
        auVar29._14_2_ = auVar32._0_2_;
        auVar29 = vpmullw_avx(auVar29,_DAT_0051da40);
        auVar32 = vpsrlw_avx(auVar29,1);
        auVar32 = vpand_avx(auVar32,_DAT_0051da50);
        uVar9 = -dx;
        auVar40._8_8_ = 0x1f001f001f001f;
        auVar40._0_8_ = 0x1f001f001f001f;
        auVar70._8_2_ = 0x10;
        auVar70._0_8_ = 0x10001000100010;
        auVar70._10_2_ = 0x10;
        auVar70._12_2_ = 0x10;
        auVar70._14_2_ = 0x10;
        auVar70._16_2_ = 0x10;
        auVar70._18_2_ = 0x10;
        auVar70._20_2_ = 0x10;
        auVar70._22_2_ = 0x10;
        auVar70._24_2_ = 0x10;
        auVar70._26_2_ = 0x10;
        auVar70._28_2_ = 0x10;
        auVar70._30_2_ = 0x10;
        sVar19 = 0;
        auVar99[8] = 0xf;
        auVar99._0_8_ = 0xf0f0f0f0f0f0f0f;
        auVar99[9] = 0xf;
        auVar99[10] = 0xf;
        auVar99[0xb] = 0xf;
        auVar99[0xc] = 0xf;
        auVar99[0xd] = 0xf;
        auVar99[0xe] = 0xf;
        auVar99[0xf] = 0xf;
        iVar8 = dx;
        do {
          uVar16 = (int)uVar9 >> (6 - bVar6 & 0x1f);
          iVar5 = (int)(~uVar16 + iVar20) >> (bVar6 & 0x1f);
          if (iVar20 + -1 <= (int)uVar16) {
            iVar5 = 0;
          }
          uVar22 = (int)((iVar20 + upsample_above) - uVar16) >> (bVar6 & 0x1f);
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if (7 < (int)uVar22) {
            uVar22 = 8;
          }
          auVar71 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar89 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (iVar5 < 8) {
            lVar10 = (long)iVar5;
            auVar87 = *(undefined1 (*) [16])(above + (int)uVar16 + lVar10);
            auVar65._0_2_ = (undefined2)iVar8;
            if (upsample_above == 0) {
              auVar87 = vpshufb_avx(auVar87,(undefined1  [16])HighbdLoadMaskx[lVar10]);
              auVar77 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + lVar10 + 1),
                                    (undefined1  [16])HighbdLoadMaskx[lVar10]);
              auVar66._2_2_ = auVar65._0_2_;
              auVar66._0_2_ = auVar65._0_2_;
              auVar66._4_2_ = auVar65._0_2_;
              auVar66._6_2_ = auVar65._0_2_;
              auVar66._8_2_ = auVar65._0_2_;
              auVar66._10_2_ = auVar65._0_2_;
              auVar66._12_2_ = auVar65._0_2_;
              auVar66._14_2_ = auVar65._0_2_;
              auVar65 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar66);
              auVar67 = vpinsrw_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
              auVar67 = vpinsrw_avx(auVar67,uVar9 + 0x80,2);
              auVar67 = vpinsrw_avx(auVar67,uVar9 + 0xc0,3);
              auVar67 = vpunpcklqdq_avx(auVar67,auVar65);
            }
            else {
              auVar77 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar10];
              auVar67 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar10] + 0x10);
              auVar66 = vpshufb_avx(auVar87,auVar77);
              auVar97 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + lVar10 + 8),
                                    auVar77);
              auVar26 = vpshufb_avx(auVar87,auVar67);
              auVar24 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + lVar10 + 8),
                                    auVar67);
              auVar87 = vpcmpgtb_avx(auVar77,auVar99);
              auVar87 = vpblendvb_avx(auVar66,auVar97,auVar87);
              auVar77 = vpcmpgtb_avx(auVar67,auVar99);
              auVar77 = vpblendvb_avx(auVar26,auVar24,auVar77);
              auVar65._2_2_ = auVar65._0_2_;
              auVar65._4_2_ = auVar65._0_2_;
              auVar65._6_2_ = auVar65._0_2_;
              auVar65._8_2_ = auVar65._0_2_;
              auVar65._10_2_ = auVar65._0_2_;
              auVar65._12_2_ = auVar65._0_2_;
              auVar65._14_2_ = auVar65._0_2_;
              auVar65 = vpsubw_avx(SUB6416(ZEXT864(0x1c0018001400100),0),auVar65);
              auVar67 = vpinsrw_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
              auVar67 = vpinsrw_avx(auVar67,uVar9 + 0x80,2);
              auVar67 = vpinsrw_avx(auVar67,uVar9 + 0xc0,3);
              auVar67 = vpunpcklqdq_avx(auVar67,auVar65);
              auVar67 = vpsllw_avx(auVar67,ZEXT416((uint)upsample_above));
            }
            auVar67 = vpsrlw_avx(auVar67,1);
            auVar67 = vpand_avx(auVar67,auVar40);
            auVar71._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar67;
            auVar71._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
            auVar80._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar87;
            auVar80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
            auVar89._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar77;
            auVar89._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
          }
          auVar90 = auVar89;
          auVar72 = auVar71;
          auVar81 = auVar80;
          if ((int)uVar16 < iVar20) {
            auVar97._2_2_ = sVar19;
            auVar97._0_2_ = sVar19;
            auVar97._4_2_ = sVar19;
            auVar97._6_2_ = sVar19;
            auVar97._8_2_ = sVar19;
            auVar97._10_2_ = sVar19;
            auVar97._12_2_ = sVar19;
            auVar97._14_2_ = sVar19;
            auVar87 = vpaddw_avx(auVar97,auVar29);
            auVar77 = auVar32;
            if (upsample_left != 0) {
              auVar77 = vpsllw_avx(auVar87,ZEXT416((uint)upsample_left));
              auVar77 = vpsrlw_avx(auVar77,1);
              auVar77 = vpand_avx(auVar77,auVar40);
            }
            auVar67 = vpsraw_avx(auVar87,ZEXT416(6U - upsample_left));
            auVar87 = vpcmpgtw_avx(auVar52,auVar67);
            auVar87 = vpandn_avx(auVar87,auVar67);
            uVar11 = vpextrw_avx(auVar87,1);
            uVar12 = vpextrw_avx(auVar87,2);
            uVar13 = vpextrw_avx(auVar87,3);
            uVar14 = vpextrw_avx(auVar87,4);
            uVar17 = vpextrw_avx(auVar87,5);
            uVar15 = vpextrw_avx(auVar87,6);
            uVar21 = vpextrw_avx(auVar87,7);
            auVar67 = vpinsrw_avx(ZEXT216(left[auVar87._0_2_]),(uint)left[(short)uVar11],1);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar12],2);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar13],3);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar14],4);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar17],5);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar15],6);
            auVar67 = vpinsrw_avx(auVar67,(uint)left[(short)uVar21],7);
            auVar87 = vpinsrw_avx(ZEXT216(left[(long)auVar87._0_2_ + 1]),
                                  (uint)left[(long)(short)uVar11 + 1],1);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar12 + 1],2);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar13 + 1],3);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar14 + 1],4);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar17 + 1],5);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar15 + 1],6);
            auVar87 = vpinsrw_avx(auVar87,(uint)left[(long)(short)uVar21 + 1],7);
            auVar81._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar80._0_16_;
            auVar81._16_16_ = ZEXT116(0) * auVar80._16_16_ + ZEXT116(1) * auVar67;
            auVar90._0_16_ = ZEXT116(0) * auVar87 + ZEXT116(1) * auVar89._0_16_;
            auVar90._16_16_ = ZEXT116(0) * auVar89._16_16_ + ZEXT116(1) * auVar87;
            auVar72._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar71._0_16_;
            auVar72._16_16_ = ZEXT116(0) * auVar71._16_16_ + ZEXT116(1) * auVar77;
          }
          auVar55 = vpsubw_avx2(auVar90,auVar81);
          auVar55 = vpmullw_avx2(auVar55,auVar72);
          auVar43 = vpsllw_avx2(auVar81,5);
          auVar55 = vpaddw_avx2(auVar55,auVar43);
          auVar55 = vpaddw_avx2(auVar55,auVar70);
          auVar55 = vpsrlw_avx2(auVar55,5);
          auVar87 = vpblendvb_avx(auVar55._0_16_,auVar55._16_16_,
                                  *(undefined1 (*) [16])HighbdBaseMask[uVar22]);
          *local_70 = auVar87;
          local_70 = (undefined1 (*) [16])(*local_70 + stride * 2);
          sVar19 = sVar19 + 0x40;
          uVar9 = uVar9 - dx;
          iVar8 = iVar8 + dx;
          local_7c = local_7c + -1;
        } while (local_7c != 0);
      }
    }
    else if (0 < bh) {
      auVar43._4_4_ = iVar8;
      auVar43._0_4_ = iVar8;
      auVar43._8_4_ = iVar8;
      auVar43._12_4_ = iVar8;
      auVar43._16_4_ = iVar8;
      auVar43._20_4_ = iVar8;
      auVar43._24_4_ = iVar8;
      auVar43._28_4_ = iVar8;
      auVar55._4_4_ = dy;
      auVar55._0_4_ = dy;
      auVar55._8_4_ = dy;
      auVar55._12_4_ = dy;
      auVar55._16_4_ = dy;
      auVar55._20_4_ = dy;
      auVar55._24_4_ = dy;
      auVar55._28_4_ = dy;
      auVar70 = vpmulld_avx2(auVar55,_DAT_0051ef80);
      auVar55 = vpsrld_avx2(auVar70,1);
      auVar74._8_4_ = 0x1f;
      auVar74._0_8_ = 0x1f0000001f;
      auVar74._12_4_ = 0x1f;
      auVar74._16_4_ = 0x1f;
      auVar74._20_4_ = 0x1f;
      auVar74._24_4_ = 0x1f;
      auVar74._28_4_ = 0x1f;
      auVar55 = vpand_avx2(auVar55,auVar74);
      uVar9 = -dx;
      auVar47._8_4_ = 0x10;
      auVar47._0_8_ = 0x1000000010;
      auVar47._12_4_ = 0x10;
      auVar47._16_4_ = 0x10;
      auVar47._20_4_ = 0x10;
      auVar47._24_4_ = 0x10;
      auVar47._28_4_ = 0x10;
      iVar5 = 0;
      iVar8 = dx;
      do {
        uVar22 = (int)uVar9 >> (6 - bVar6 & 0x1f);
        uVar16 = (int)(~uVar22 + iVar20) >> (bVar6 & 0x1f);
        if (iVar20 + -1 <= (int)uVar22) {
          uVar16 = 0;
        }
        uVar18 = (int)((iVar20 + upsample_above) - uVar22) >> (bVar6 & 0x1f);
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        if (7 < (int)uVar18) {
          uVar18 = 8;
        }
        auVar32 = (undefined1  [16])0x0;
        if ((int)uVar16 < 8) {
          lVar10 = (long)(int)uVar16;
          auVar32 = *(undefined1 (*) [16])(above + (int)uVar22 + lVar10);
          if (upsample_above == 0) {
            auVar32 = vpshufb_avx(auVar32,(undefined1  [16])HighbdLoadMaskx[lVar10]);
            auVar29 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar22 + lVar10 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[lVar10]);
            auVar87._4_4_ = iVar8;
            auVar87._0_4_ = iVar8;
            auVar87._8_4_ = iVar8;
            auVar87._12_4_ = iVar8;
            iVar1 = uVar9 + 0x140;
            iVar2 = uVar9 + 0x180;
            iVar3 = uVar9 + 0x1c0;
            auVar52 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar52 = vpsubd_avx(auVar52,auVar87);
            auVar91 = vpermq_avx2(ZEXT1632(auVar52),0xc4);
            auVar91 = vpblendd_avx2(auVar91,ZEXT432(uVar9),1);
            auVar50._4_4_ = iVar1;
            auVar50._0_4_ = iVar1;
            auVar50._8_4_ = iVar1;
            auVar50._12_4_ = iVar1;
            auVar50._16_4_ = iVar1;
            auVar50._20_4_ = iVar1;
            auVar50._24_4_ = iVar1;
            auVar50._28_4_ = iVar1;
            auVar91 = vpblendd_avx2(auVar91,auVar50,0x20);
            auVar49._4_4_ = iVar2;
            auVar49._0_4_ = iVar2;
            auVar49._8_4_ = iVar2;
            auVar49._12_4_ = iVar2;
            auVar49._16_4_ = iVar2;
            auVar49._20_4_ = iVar2;
            auVar49._24_4_ = iVar2;
            auVar49._28_4_ = iVar2;
            auVar91 = vpblendd_avx2(auVar91,auVar49,0x40);
            auVar63._4_4_ = iVar3;
            auVar63._0_4_ = iVar3;
            auVar63._8_4_ = iVar3;
            auVar63._12_4_ = iVar3;
            auVar63._16_4_ = iVar3;
            auVar63._20_4_ = iVar3;
            auVar63._24_4_ = iVar3;
            auVar63._28_4_ = iVar3;
            auVar91 = vpblendd_avx2(auVar91,auVar63,0x80);
          }
          else {
            auVar29 = *(undefined1 (*) [16])HighbdEvenOddMaskx[lVar10];
            auVar52 = *(undefined1 (*) [16])(HighbdEvenOddMaskx[lVar10] + 0x10);
            auVar87 = vpshufb_avx(auVar32,auVar29);
            auVar77 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar22 + lVar10 + 8),
                                  auVar29);
            auVar67[8] = 0xf;
            auVar67._0_8_ = 0xf0f0f0f0f0f0f0f;
            auVar67[9] = 0xf;
            auVar67[10] = 0xf;
            auVar67[0xb] = 0xf;
            auVar67[0xc] = 0xf;
            auVar67[0xd] = 0xf;
            auVar67[0xe] = 0xf;
            auVar67[0xf] = 0xf;
            auVar40 = vpshufb_avx(auVar32,auVar52);
            auVar32 = vpcmpgtb_avx(auVar29,auVar67);
            auVar32 = vpblendvb_avx(auVar87,auVar77,auVar32);
            auVar87 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar22 + lVar10 + 8),
                                  auVar52);
            auVar29 = vpcmpgtb_avx(auVar52,auVar67);
            auVar29 = vpblendvb_avx(auVar40,auVar87,auVar29);
            auVar77._4_4_ = iVar8;
            auVar77._0_4_ = iVar8;
            auVar77._8_4_ = iVar8;
            auVar77._12_4_ = iVar8;
            iVar1 = uVar9 + 0x140;
            iVar2 = uVar9 + 0x180;
            iVar3 = uVar9 + 0x1c0;
            auVar52 = vpmovsxwd_avx(ZEXT816(0xc0008000400100));
            auVar52 = vpsubd_avx(auVar52,auVar77);
            auVar91 = vpermq_avx2(ZEXT1632(auVar52),0xc4);
            auVar91 = vpblendd_avx2(auVar91,ZEXT432(uVar9),1);
            auVar60._4_4_ = iVar1;
            auVar60._0_4_ = iVar1;
            auVar60._8_4_ = iVar1;
            auVar60._12_4_ = iVar1;
            auVar60._16_4_ = iVar1;
            auVar60._20_4_ = iVar1;
            auVar60._24_4_ = iVar1;
            auVar60._28_4_ = iVar1;
            auVar91 = vpblendd_avx2(auVar91,auVar60,0x20);
            auVar61._4_4_ = iVar2;
            auVar61._0_4_ = iVar2;
            auVar61._8_4_ = iVar2;
            auVar61._12_4_ = iVar2;
            auVar61._16_4_ = iVar2;
            auVar61._20_4_ = iVar2;
            auVar61._24_4_ = iVar2;
            auVar61._28_4_ = iVar2;
            auVar91 = vpblendd_avx2(auVar91,auVar61,0x40);
            auVar62._4_4_ = iVar3;
            auVar62._0_4_ = iVar3;
            auVar62._8_4_ = iVar3;
            auVar62._12_4_ = iVar3;
            auVar62._16_4_ = iVar3;
            auVar62._20_4_ = iVar3;
            auVar62._24_4_ = iVar3;
            auVar62._28_4_ = iVar3;
            auVar91 = vpblendd_avx2(auVar91,auVar62,0x80);
            auVar91 = vpslld_avx2(auVar91,ZEXT416((uint)upsample_above));
          }
          auVar49 = vpsrld_avx2(auVar91,1);
          auVar91 = vpmovzxwd_avx2(auVar32);
          auVar50 = vpmovzxwd_avx2(auVar29);
          auVar50 = vpsubd_avx2(auVar50,auVar91);
          auVar63 = vpslld_avx2(auVar91,5);
          auVar91 = vpand_avx2(auVar49,auVar74);
          auVar50 = vpmulld_avx2(auVar50,auVar91);
          auVar91 = vpaddd_avx2(auVar63,auVar47);
          auVar91 = vpaddd_avx2(auVar50,auVar91);
          auVar91 = vpsrld_avx2(auVar91,5);
          auVar32 = vpackusdw_avx(auVar91._0_16_,auVar91._16_16_);
        }
        auVar29 = auVar32;
        if ((int)uVar22 < iVar20) {
          auVar91._4_4_ = iVar5;
          auVar91._0_4_ = iVar5;
          auVar91._8_4_ = iVar5;
          auVar91._12_4_ = iVar5;
          auVar91._16_4_ = iVar5;
          auVar91._20_4_ = iVar5;
          auVar91._24_4_ = iVar5;
          auVar91._28_4_ = iVar5;
          auVar91 = vpaddd_avx2(auVar91,auVar70);
          auVar50 = auVar55;
          if (upsample_left != 0) {
            auVar50 = vpslld_avx2(auVar91,ZEXT416((uint)upsample_left));
            auVar50 = vpsrld_avx2(auVar50,1);
            auVar50 = vpand_avx2(auVar50,auVar74);
          }
          auVar49 = vpsrad_avx2(auVar91,ZEXT416(6U - upsample_left));
          auVar91 = vpcmpgtd_avx2(auVar43,auVar49);
          auVar91 = vpandn_avx2(auVar91,auVar49);
          auVar29 = vpinsrw_avx(ZEXT216(left[auVar91._0_4_]),(uint)left[auVar91._4_4_],1);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._8_4_],2);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._12_4_],3);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._16_4_],4);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._20_4_],5);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._24_4_],6);
          auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._28_4_],7);
          auVar52 = vpinsrw_avx(ZEXT216(left[(long)auVar91._0_4_ + 1]),
                                (uint)left[(long)auVar91._4_4_ + 1],1);
          auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._8_4_ + 1],2);
          auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._12_4_ + 1],3);
          auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._16_4_ + 1],4);
          auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._20_4_ + 1],5);
          auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._24_4_ + 1],6);
          auVar49 = vpmovzxwd_avx2(auVar29);
          auVar29 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._28_4_ + 1],7);
          auVar91 = vpmovzxwd_avx2(auVar29);
          auVar91 = vpsubd_avx2(auVar91,auVar49);
          auVar50 = vpmulld_avx2(auVar50,auVar91);
          auVar91 = vpslld_avx2(auVar49,5);
          auVar91 = vpaddd_avx2(auVar91,auVar47);
          auVar91 = vpaddd_avx2(auVar50,auVar91);
          auVar91 = vpsrld_avx2(auVar91,5);
          auVar29 = vpackusdw_avx(auVar91._0_16_,auVar91._16_16_);
        }
        auVar32 = vpblendvb_avx(auVar32,auVar29,*(undefined1 (*) [16])HighbdBaseMask[uVar18]);
        *local_70 = auVar32;
        local_70 = (undefined1 (*) [16])(*local_70 + stride * 2);
        iVar5 = iVar5 + 0x40;
        uVar9 = uVar9 - dx;
        iVar8 = iVar8 + dx;
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  else if (bw == 4) {
    iVar20 = -1 << (bVar6 & 0x1f);
    iVar8 = -1 << ((byte)upsample_left & 0x1f);
    if (bd < 0xc) {
      if (0 < bh) {
        auVar23._0_2_ = (undefined2)iVar8;
        auVar23._2_2_ = auVar23._0_2_;
        auVar23._4_2_ = auVar23._0_2_;
        auVar23._6_2_ = auVar23._0_2_;
        auVar23._8_2_ = auVar23._0_2_;
        auVar23._10_2_ = auVar23._0_2_;
        auVar23._12_2_ = auVar23._0_2_;
        auVar23._14_2_ = auVar23._0_2_;
        auVar32._2_2_ = auVar32._0_2_;
        auVar32._4_2_ = auVar32._0_2_;
        auVar32._6_2_ = auVar32._0_2_;
        auVar32._8_2_ = auVar32._0_2_;
        auVar32._10_2_ = auVar32._0_2_;
        auVar32._12_2_ = auVar32._0_2_;
        auVar32._14_2_ = auVar32._0_2_;
        auVar29 = vpmullw_avx(auVar32,_DAT_0051da70);
        auVar32 = vpsrlw_avx(auVar29,1);
        auVar32 = vpand_avx(auVar32,_DAT_0051da50);
        uVar9 = -dx;
        auVar39._8_8_ = 0x1f001f001f001f;
        auVar39._0_8_ = 0x1f001f001f001f;
        auVar44._8_2_ = 0x10;
        auVar44._0_8_ = 0x10001000100010;
        auVar44._10_2_ = 0x10;
        auVar44._12_2_ = 0x10;
        auVar44._14_2_ = 0x10;
        auVar44._16_2_ = 0x10;
        auVar44._18_2_ = 0x10;
        auVar44._20_2_ = 0x10;
        auVar44._22_2_ = 0x10;
        auVar44._24_2_ = 0x10;
        auVar44._26_2_ = 0x10;
        auVar44._28_2_ = 0x10;
        auVar44._30_2_ = 0x10;
        sVar19 = 0;
        do {
          uVar16 = (int)uVar9 >> (6 - bVar6 & 0x1f);
          iVar8 = (int)(~uVar16 + iVar20) >> (bVar6 & 0x1f);
          if (iVar20 + -1 <= (int)uVar16) {
            iVar8 = 0;
          }
          uVar22 = (int)((iVar20 + upsample_above) - uVar16) >> (bVar6 & 0x1f);
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          if (3 < (int)uVar22) {
            uVar22 = 4;
          }
          auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar78 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar68 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (iVar8 < 4) {
            auVar52 = vpinsrw_avx(ZEXT416(uVar9 & 0xffff),uVar9 + 0x40,1);
            auVar52 = vpinsrw_avx(auVar52,uVar9 + 0x80,2);
            auVar52 = vpinsrw_avx(auVar52,uVar9 + 0xc0,3);
            if (upsample_above == 0) {
              auVar87 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + (long)iVar8),
                                    (undefined1  [16])HighbdLoadMaskx[iVar8]);
              auVar77 = vpsrldq_avx(auVar87,2);
            }
            else {
              auVar87 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + (long)iVar8),
                                    (undefined1  [16])HighbdEvenOddMaskx4[iVar8]);
              auVar77 = vpsrldq_avx(auVar87,8);
              auVar52 = vpsllw_avx(auVar52,ZEXT416((uint)upsample_above));
            }
            auVar52 = vpsrlw_avx(auVar52,1);
            auVar52 = vpand_avx(auVar52,auVar39);
            auVar53._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar52;
            auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
            auVar68._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar87;
            auVar68._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
            auVar78._0_16_ = ZEXT116(0) * auVar23 + ZEXT116(1) * auVar77;
            auVar78._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23;
          }
          auVar79 = auVar78;
          auVar54 = auVar53;
          auVar69 = auVar68;
          if ((int)uVar16 < iVar20) {
            auVar86._2_2_ = sVar19;
            auVar86._0_2_ = sVar19;
            auVar86._4_2_ = sVar19;
            auVar86._6_2_ = sVar19;
            auVar86._8_2_ = sVar19;
            auVar86._10_2_ = sVar19;
            auVar86._12_2_ = sVar19;
            auVar86._14_2_ = sVar19;
            auVar52 = vpaddw_avx(auVar86,auVar29);
            auVar87 = auVar32;
            if (upsample_left != 0) {
              auVar87 = vpsllw_avx(auVar52,ZEXT416((uint)upsample_left));
              auVar87 = vpsrlw_avx(auVar87,1);
              auVar87 = vpand_avx(auVar87,auVar39);
            }
            auVar77 = vpsraw_avx(auVar52,ZEXT416(6U - upsample_left));
            auVar52 = vpcmpgtw_avx(auVar23,auVar77);
            auVar52 = vpandn_avx(auVar52,auVar77);
            uVar11 = vpextrw_avx(auVar52,1);
            uVar15 = vpextrw_avx(auVar52,2);
            uVar17 = vpextrw_avx(auVar52,3);
            auVar77 = vpinsrw_avx(ZEXT216(left[auVar52._0_2_]),(uint)left[(short)uVar11],1);
            auVar77 = vpinsrw_avx(auVar77,(uint)left[(short)uVar15],2);
            auVar77 = vpinsrw_avx(auVar77,(uint)left[(short)uVar17],3);
            auVar52 = vpinsrw_avx(ZEXT216(left[(long)auVar52._0_2_ + 1]),
                                  (uint)left[(long)(short)uVar11 + 1],1);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)(short)uVar15 + 1],2);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)(short)uVar17 + 1],3);
            auVar69._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar68._0_16_;
            auVar69._16_16_ = ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar77;
            auVar79._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar78._0_16_;
            auVar79._16_16_ = ZEXT116(0) * auVar78._16_16_ + ZEXT116(1) * auVar52;
            auVar54._0_16_ = ZEXT116(0) * auVar87 + ZEXT116(1) * auVar53._0_16_;
            auVar54._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar87;
          }
          auVar55 = vpsubw_avx2(auVar79,auVar69);
          auVar55 = vpmullw_avx2(auVar55,auVar54);
          auVar70 = vpsllw_avx2(auVar69,5);
          auVar55 = vpaddw_avx2(auVar70,auVar55);
          auVar55 = vpaddw_avx2(auVar55,auVar44);
          auVar55 = vpsrlw_avx2(auVar55,5);
          auVar52 = vpblendvb_avx(auVar55._0_16_,auVar55._16_16_,
                                  *(undefined1 (*) [16])HighbdBaseMask[uVar22]);
          *(long *)local_70 = auVar52._0_8_;
          local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
          sVar19 = sVar19 + 0x40;
          uVar9 = uVar9 - dx;
          local_7c = local_7c + -1;
        } while (local_7c != 0);
      }
    }
    else if (0 < bh) {
      auVar25._4_4_ = iVar8;
      auVar25._0_4_ = iVar8;
      auVar25._8_4_ = iVar8;
      auVar25._12_4_ = iVar8;
      auVar30._4_4_ = dy;
      auVar30._0_4_ = dy;
      auVar30._8_4_ = dy;
      auVar30._12_4_ = dy;
      auVar29 = vpmulld_avx(auVar30,_DAT_0051f090);
      auVar32 = vpsrld_avx(auVar29,1);
      auVar34._8_4_ = 0x1f;
      auVar34._0_8_ = 0x1f0000001f;
      auVar34._12_4_ = 0x1f;
      auVar32 = vpand_avx(auVar32,auVar34);
      uVar9 = -dx;
      auVar41._8_8_ = 0x1f0000001f;
      auVar41._0_8_ = 0x1f0000001f;
      auVar48._8_4_ = 0x10;
      auVar48._0_8_ = 0x1000000010;
      auVar48._12_4_ = 0x10;
      auVar48._16_4_ = 0x10;
      auVar48._20_4_ = 0x10;
      auVar48._24_4_ = 0x10;
      auVar48._28_4_ = 0x10;
      iVar8 = 0;
      do {
        uVar16 = (int)uVar9 >> (6 - bVar6 & 0x1f);
        iVar5 = (int)(~uVar16 + iVar20) >> (bVar6 & 0x1f);
        if (iVar20 + -1 <= (int)uVar16) {
          iVar5 = 0;
        }
        uVar22 = (int)((iVar20 + upsample_above) - uVar16) >> (bVar6 & 0x1f);
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        if (3 < (int)uVar22) {
          uVar22 = 4;
        }
        auVar58 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar70 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar55 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (iVar5 < 4) {
          auVar52 = vpinsrd_avx(ZEXT416(uVar9),uVar9 + 0x40,1);
          auVar52 = vpinsrd_avx(auVar52,uVar9 + 0x80,2);
          auVar52 = vpinsrd_avx(auVar52,uVar9 + 0xc0,3);
          if (upsample_above == 0) {
            auVar87 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + (long)iVar5),
                                  (undefined1  [16])HighbdLoadMaskx[iVar5]);
            auVar77 = vpsrldq_avx(auVar87,2);
          }
          else {
            auVar87 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + (long)iVar5),
                                  (undefined1  [16])HighbdEvenOddMaskx4[iVar5]);
            auVar77 = vpsrldq_avx(auVar87,8);
            auVar52 = vpslld_avx(auVar52,ZEXT416((uint)upsample_above));
          }
          auVar52 = vpsrld_avx(auVar52,1);
          auVar52 = vpand_avx(auVar52,auVar41);
          auVar58._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar52;
          auVar58._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
          auVar55 = vpmovzxwd_avx2(auVar87);
          auVar70 = vpmovzxwd_avx2(auVar77);
        }
        auVar85 = auVar70;
        auVar59 = auVar58;
        auVar75 = auVar55;
        if ((int)uVar16 < iVar20) {
          auVar88._4_4_ = iVar8;
          auVar88._0_4_ = iVar8;
          auVar88._8_4_ = iVar8;
          auVar88._12_4_ = iVar8;
          auVar52 = vpaddd_avx(auVar88,auVar29);
          auVar87 = auVar32;
          if (upsample_left != 0) {
            auVar87 = vpslld_avx(auVar52,ZEXT416((uint)upsample_left));
            auVar87 = vpsrld_avx(auVar87,1);
            auVar87 = vpand_avx(auVar87,auVar41);
          }
          auVar77 = vpsrad_avx(auVar52,ZEXT416(6U - upsample_left));
          auVar52 = vpcmpgtd_avx(auVar25,auVar77);
          auVar52 = vpandn_avx(auVar52,auVar77);
          auVar77 = vpinsrd_avx(ZEXT216(left[auVar52._0_4_]),(uint)left[auVar52._4_4_],1);
          auVar77 = vpinsrd_avx(auVar77,(uint)left[auVar52._8_4_],2);
          auVar77 = vpinsrd_avx(auVar77,(uint)left[auVar52._12_4_],3);
          auVar40 = vpinsrd_avx(ZEXT216(left[(long)auVar52._0_4_ + 1]),
                                (uint)left[(long)auVar52._4_4_ + 1],1);
          auVar40 = vpinsrd_avx(auVar40,(uint)left[(long)auVar52._8_4_ + 1],2);
          auVar52 = vpinsrd_avx(auVar40,(uint)left[(long)auVar52._12_4_ + 1],3);
          auVar75._0_16_ = ZEXT116(0) * auVar77 + ZEXT116(1) * auVar55._0_16_;
          auVar75._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar77;
          auVar85._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar70._0_16_;
          auVar85._16_16_ = ZEXT116(0) * auVar70._16_16_ + ZEXT116(1) * auVar52;
          auVar59._0_16_ = ZEXT116(0) * auVar87 + ZEXT116(1) * auVar58._0_16_;
          auVar59._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar87;
        }
        auVar55 = vpsubd_avx2(auVar85,auVar75);
        auVar55 = vpmulld_avx2(auVar55,auVar59);
        auVar70 = vpslld_avx2(auVar75,5);
        auVar55 = vpaddd_avx2(auVar70,auVar55);
        auVar55 = vpaddd_avx2(auVar55,auVar48);
        auVar55 = vpsrld_avx2(auVar55,5);
        auVar52 = vpackusdw_avx(auVar55._0_16_,auVar55._0_16_);
        auVar87 = vpackusdw_avx(auVar55._16_16_,auVar55._16_16_);
        auVar52 = vpblendvb_avx(auVar52,auVar87,*(undefined1 (*) [16])HighbdBaseMask[uVar22]);
        *(long *)local_70 = auVar52._0_8_;
        local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
        iVar8 = iVar8 + 0x40;
        uVar9 = uVar9 - dx;
        local_7c = local_7c + -1;
      } while (local_7c != 0);
    }
  }
  else if (bd < 0xc) {
    if (0 < bh) {
      auVar24._2_2_ = auVar32._0_2_;
      auVar24._0_2_ = auVar32._0_2_;
      auVar24._4_2_ = auVar32._0_2_;
      auVar24._6_2_ = auVar32._0_2_;
      auVar24._8_2_ = auVar32._0_2_;
      auVar24._10_2_ = auVar32._0_2_;
      auVar24._12_2_ = auVar32._0_2_;
      auVar24._14_2_ = auVar32._0_2_;
      auVar27._16_2_ = auVar32._0_2_;
      auVar27._0_16_ = auVar24;
      auVar27._18_2_ = auVar32._0_2_;
      auVar27._20_2_ = auVar32._0_2_;
      auVar27._22_2_ = auVar32._0_2_;
      auVar27._24_2_ = auVar32._0_2_;
      auVar27._26_2_ = auVar32._0_2_;
      auVar27._28_2_ = auVar32._0_2_;
      auVar27._30_2_ = auVar32._0_2_;
      iVar8 = -dx;
      auVar31._8_2_ = 0x10;
      auVar31._0_8_ = 0x10001000100010;
      auVar31._10_2_ = 0x10;
      auVar31._12_2_ = 0x10;
      auVar31._14_2_ = 0x10;
      auVar31._16_2_ = 0x10;
      auVar31._18_2_ = 0x10;
      auVar31._20_2_ = 0x10;
      auVar31._22_2_ = 0x10;
      auVar31._24_2_ = 0x10;
      auVar31._26_2_ = 0x10;
      auVar31._28_2_ = 0x10;
      auVar31._30_2_ = 0x10;
      auVar70 = vpmovsxbw_avx2(_DAT_0051f0a0);
      auVar55 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
      iVar20 = 0;
      do {
        iVar5 = iVar20 + 1;
        if (0 < bw) {
          uVar4 = (ushort)((uint)-(iVar5 * dx) >> 1);
          uVar36 = uVar4 & 0x1f;
          auVar37._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
          auVar37._8_2_ = uVar36;
          auVar37._10_2_ = uVar36;
          auVar37._12_2_ = uVar36;
          auVar37._14_2_ = uVar36;
          auVar37._16_2_ = uVar36;
          auVar37._18_2_ = uVar36;
          auVar37._20_2_ = uVar36;
          auVar37._22_2_ = uVar36;
          auVar37._24_2_ = uVar36;
          auVar37._26_2_ = uVar36;
          auVar37._28_2_ = uVar36;
          auVar37._30_2_ = uVar36;
          auVar42._0_2_ = (undefined2)iVar20;
          auVar42._2_2_ = auVar42._0_2_;
          auVar42._4_2_ = auVar42._0_2_;
          auVar42._6_2_ = auVar42._0_2_;
          auVar42._8_2_ = auVar42._0_2_;
          auVar42._10_2_ = auVar42._0_2_;
          auVar42._12_2_ = auVar42._0_2_;
          auVar42._14_2_ = auVar42._0_2_;
          auVar42._16_2_ = auVar42._0_2_;
          auVar42._18_2_ = auVar42._0_2_;
          auVar42._20_2_ = auVar42._0_2_;
          auVar42._22_2_ = auVar42._0_2_;
          auVar42._24_2_ = auVar42._0_2_;
          auVar42._26_2_ = auVar42._0_2_;
          auVar42._28_2_ = auVar42._0_2_;
          auVar42._30_2_ = auVar42._0_2_;
          auVar43 = vpsllw_avx2(auVar42,6);
          lVar10 = 0;
          iVar20 = iVar8;
          do {
            uVar16 = iVar20 >> 6;
            uVar9 = -(uVar16 + 2);
            if (-3 < (int)uVar16) {
              uVar9 = 0;
            }
            uVar22 = 0xffffffff;
            if ((int)uVar16 < -1) {
              uVar22 = uVar16;
            }
            uVar22 = ~uVar22;
            if ((int)uVar16 < -0x11) {
              uVar22 = 0x10;
            }
            auVar45 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar56 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            if ((int)uVar9 < 8) {
              uVar7 = (ulong)uVar9;
              auVar32 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7),
                                    (undefined1  [16])HighbdLoadMaskx[uVar7]);
              auVar29 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 1),
                                    (undefined1  [16])HighbdLoadMaskx[uVar7]);
              auVar56._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar32;
              auVar56._16_16_ = ZEXT116(1) * auVar24;
              auVar45._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar29;
              auVar45._16_16_ = ZEXT116(1) * auVar24;
            }
            uVar18 = uVar9 - 8;
            if ((int)uVar9 < 9) {
              uVar18 = 0;
            }
            auVar46 = auVar45;
            auVar57 = auVar56;
            if ((int)uVar18 < 8) {
              uVar7 = (ulong)uVar18;
              auVar32 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 8),
                                    (undefined1  [16])HighbdLoadMaskx[uVar7]);
              auVar29 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 9),
                                    (undefined1  [16])HighbdLoadMaskx[uVar7]);
              auVar57._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar56._0_16_;
              auVar57._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar32;
              auVar46._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar45._0_16_;
              auVar46._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar29;
            }
            auVar74 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            if ((int)uVar16 < -1) {
              auVar73._0_2_ = (undefined2)lVar10;
              auVar73._2_2_ = auVar73._0_2_;
              auVar73._4_2_ = auVar73._0_2_;
              auVar73._6_2_ = auVar73._0_2_;
              auVar73._8_2_ = auVar73._0_2_;
              auVar73._10_2_ = auVar73._0_2_;
              auVar73._12_2_ = auVar73._0_2_;
              auVar73._14_2_ = auVar73._0_2_;
              auVar73._16_2_ = auVar73._0_2_;
              auVar73._18_2_ = auVar73._0_2_;
              auVar73._20_2_ = auVar73._0_2_;
              auVar73._22_2_ = auVar73._0_2_;
              auVar73._24_2_ = auVar73._0_2_;
              auVar73._26_2_ = auVar73._0_2_;
              auVar73._28_2_ = auVar73._0_2_;
              auVar73._30_2_ = auVar73._0_2_;
              auVar74 = vpaddw_avx2(auVar73,auVar70);
              auVar74 = vpmullw_avx2(auVar74,auVar27);
              auVar82._8_2_ = 0x7fff;
              auVar82._0_8_ = 0x7fff7fff7fff7fff;
              auVar82._10_2_ = 0x7fff;
              auVar82._12_2_ = 0x7fff;
              auVar82._14_2_ = 0x7fff;
              auVar82._16_2_ = 0x7fff;
              auVar82._18_2_ = 0x7fff;
              auVar82._20_2_ = 0x7fff;
              auVar82._22_2_ = 0x7fff;
              auVar82._24_2_ = 0x7fff;
              auVar82._26_2_ = 0x7fff;
              auVar82._28_2_ = 0x7fff;
              auVar82._30_2_ = 0x7fff;
              auVar74 = vpminuw_avx2(auVar74,auVar82);
              auVar47 = vpsubw_avx2(auVar43,auVar74);
              auVar83._8_2_ = 0xfffe;
              auVar83._0_8_ = 0xfffefffefffefffe;
              auVar83._10_2_ = 0xfffe;
              auVar83._12_2_ = 0xfffe;
              auVar83._14_2_ = 0xfffe;
              auVar83._16_2_ = 0xfffe;
              auVar83._18_2_ = 0xfffe;
              auVar83._20_2_ = 0xfffe;
              auVar83._22_2_ = 0xfffe;
              auVar83._24_2_ = 0xfffe;
              auVar83._26_2_ = 0xfffe;
              auVar83._28_2_ = 0xfffe;
              auVar83._30_2_ = 0xfffe;
              auVar91 = vpsraw_avx2(auVar47,6);
              auVar74 = vpcmpgtw_avx2(auVar91,auVar83);
              auVar74 = vpand_avx2(auVar74,auVar91);
              auVar52 = auVar74._0_16_;
              auVar29 = auVar74._16_16_;
              uVar11 = vpextrw_avx(auVar29,1);
              uVar15 = vpextrw_avx(auVar29,2);
              auVar32 = vpinsrw_avx(ZEXT216(left[auVar74._16_2_]),(uint)left[(short)uVar11],1);
              uVar11 = vpextrw_avx(auVar29,3);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar15],2);
              uVar15 = vpextrw_avx(auVar29,4);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar11],3);
              uVar11 = vpextrw_avx(auVar29,5);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar15],4);
              uVar15 = vpextrw_avx(auVar29,6);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar11],5);
              uVar11 = vpextrw_avx(auVar29,7);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar15],6);
              auVar32 = vpinsrw_avx(auVar32,(uint)left[(short)uVar11],7);
              uVar15 = vpextrw_avx(auVar52,1);
              uVar11 = vpextrw_avx(auVar52,2);
              auVar29 = vpinsrw_avx(ZEXT216(left[auVar74._0_2_]),(uint)left[(short)uVar15],1);
              uVar15 = vpextrw_avx(auVar52,3);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar11],2);
              uVar11 = vpextrw_avx(auVar52,4);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar15],3);
              uVar15 = vpextrw_avx(auVar52,5);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar11],4);
              uVar11 = vpextrw_avx(auVar52,6);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar15],5);
              uVar15 = vpextrw_avx(auVar52,7);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar11],6);
              auVar29 = vpinsrw_avx(auVar29,(uint)left[(short)uVar15],7);
              auVar74 = vpsubw_avx2(auVar74,auVar55);
              auVar77 = auVar74._0_16_;
              auVar87 = auVar74._16_16_;
              uVar11 = vpextrw_avx(auVar87,1);
              uVar15 = vpextrw_avx(auVar87,2);
              auVar52 = vpinsrw_avx(ZEXT216(left[auVar74._16_2_]),(uint)left[(short)uVar11],1);
              uVar11 = vpextrw_avx(auVar87,3);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar15],2);
              uVar15 = vpextrw_avx(auVar87,4);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar11],3);
              uVar11 = vpextrw_avx(auVar87,5);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar15],4);
              uVar15 = vpextrw_avx(auVar87,6);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar11],5);
              uVar11 = vpextrw_avx(auVar87,7);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar15],6);
              auVar52 = vpinsrw_avx(auVar52,(uint)left[(short)uVar11],7);
              uVar11 = vpextrw_avx(auVar77,1);
              auVar87 = vpinsrw_avx(ZEXT216(left[auVar74._0_2_]),(uint)left[(short)uVar11],1);
              uVar11 = vpextrw_avx(auVar77,2);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],2);
              uVar11 = vpextrw_avx(auVar77,3);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],3);
              uVar11 = vpextrw_avx(auVar77,4);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],4);
              uVar11 = vpextrw_avx(auVar77,5);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],5);
              uVar11 = vpextrw_avx(auVar77,6);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],6);
              uVar11 = vpextrw_avx(auVar77,7);
              auVar87 = vpinsrw_avx(auVar87,(uint)left[(short)uVar11],7);
              auVar84._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar29;
              auVar84._16_16_ = ZEXT116(1) * auVar32;
              auVar92._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar87;
              auVar92._16_16_ = ZEXT116(1) * auVar52;
              auVar98._8_2_ = 0x1f;
              auVar98._0_8_ = 0x1f001f001f001f;
              auVar98._10_2_ = 0x1f;
              auVar98._12_2_ = 0x1f;
              auVar98._14_2_ = 0x1f;
              auVar98._16_2_ = 0x1f;
              auVar98._18_2_ = 0x1f;
              auVar98._20_2_ = 0x1f;
              auVar98._22_2_ = 0x1f;
              auVar98._24_2_ = 0x1f;
              auVar98._26_2_ = 0x1f;
              auVar98._28_2_ = 0x1f;
              auVar98._30_2_ = 0x1f;
              auVar74 = vpsrlw_avx2(auVar47,1);
              auVar74 = vpand_avx2(auVar74,auVar98);
              auVar47 = vpsubw_avx2(auVar92,auVar84);
              auVar47 = vpmullw_avx2(auVar47,auVar74);
              auVar74 = vpsllw_avx2(auVar84,5);
              auVar74 = vpaddw_avx2(auVar74,auVar31);
              auVar74 = vpaddw_avx2(auVar47,auVar74);
              auVar74 = vpsrlw_avx2(auVar74,5);
            }
            auVar47 = vpsubw_avx2(auVar46,auVar57);
            auVar47 = vpmullw_avx2(auVar47,auVar37);
            auVar91 = vpsllw_avx2(auVar57,5);
            auVar47 = vpaddw_avx2(auVar47,auVar91);
            auVar47 = vpaddw_avx2(auVar47,auVar31);
            auVar47 = vpsrlw_avx2(auVar47,5);
            auVar74 = vpblendvb_avx2(auVar47,auVar74,(undefined1  [32])HighbdBaseMask[uVar22]);
            *(undefined1 (*) [32])((long)local_70 + lVar10 * 2) = auVar74;
            lVar10 = lVar10 + 0x10;
            iVar20 = iVar20 + 0x400;
          } while (lVar10 < bw);
        }
        local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
        iVar8 = iVar8 - dx;
        iVar20 = iVar5;
      } while (iVar5 != bh);
    }
  }
  else if (0 < bh) {
    auVar26._4_4_ = dy;
    auVar26._0_4_ = dy;
    auVar26._8_4_ = dy;
    auVar26._12_4_ = dy;
    auVar28._16_4_ = dy;
    auVar28._0_16_ = auVar26;
    auVar28._20_4_ = dy;
    auVar28._24_4_ = dy;
    auVar28._28_4_ = dy;
    iVar8 = -dx;
    auVar55 = vpmovsxbd_avx2(ZEXT816(0x807060504030201));
    auVar33._8_4_ = 0xfffffffe;
    auVar33._0_8_ = 0xfffffffefffffffe;
    auVar33._12_4_ = 0xfffffffe;
    auVar33._16_4_ = 0xfffffffe;
    auVar33._20_4_ = 0xfffffffe;
    auVar33._24_4_ = 0xfffffffe;
    auVar33._28_4_ = 0xfffffffe;
    auVar35._8_4_ = 0x1f;
    auVar35._0_8_ = 0x1f0000001f;
    auVar35._12_4_ = 0x1f;
    auVar35._16_4_ = 0x1f;
    auVar35._20_4_ = 0x1f;
    auVar35._24_4_ = 0x1f;
    auVar35._28_4_ = 0x1f;
    auVar38._8_4_ = 0x10;
    auVar38._0_8_ = 0x1000000010;
    auVar38._12_4_ = 0x10;
    auVar38._16_4_ = 0x10;
    auVar38._20_4_ = 0x10;
    auVar38._24_4_ = 0x10;
    auVar38._28_4_ = 0x10;
    auVar70 = vpmovsxbd_avx2(ZEXT816(0x100f0e0d0c0b0a09));
    iVar20 = 0;
    do {
      if (0 < bw) {
        uVar9 = (uint)-((iVar20 + 1) * dx) >> 1;
        uVar16 = uVar9 & 0x1f;
        auVar51._0_8_ = CONCAT44(uVar9,uVar9) & 0x1f0000001f;
        auVar51._8_4_ = uVar16;
        auVar51._12_4_ = uVar16;
        auVar51._16_4_ = uVar16;
        auVar51._20_4_ = uVar16;
        auVar51._24_4_ = uVar16;
        auVar51._28_4_ = uVar16;
        iVar5 = iVar20 << 6;
        auVar64._4_4_ = iVar5;
        auVar64._0_4_ = iVar5;
        auVar64._8_4_ = iVar5;
        auVar64._12_4_ = iVar5;
        auVar64._16_4_ = iVar5;
        auVar64._20_4_ = iVar5;
        auVar64._24_4_ = iVar5;
        auVar64._28_4_ = iVar5;
        lVar10 = 0;
        iVar5 = iVar8;
        do {
          uVar16 = iVar5 >> 6;
          uVar9 = -(uVar16 + 2);
          if (-3 < (int)uVar16) {
            uVar9 = 0;
          }
          uVar22 = 0xffffffff;
          if ((int)uVar16 < -1) {
            uVar22 = uVar16;
          }
          uVar22 = ~uVar22;
          if ((int)uVar16 < -0x11) {
            uVar22 = 0x10;
          }
          auVar32 = (undefined1  [16])0x0;
          auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if ((int)uVar9 < 8) {
            uVar7 = (ulong)uVar9;
            auVar29 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7),
                                  (undefined1  [16])HighbdLoadMaskx[uVar7]);
            auVar52 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 1),
                                  (undefined1  [16])HighbdLoadMaskx[uVar7]);
            auVar43 = vpmovzxwd_avx2(auVar29);
            auVar74 = vpmovzxwd_avx2(auVar52);
            auVar74 = vpsubd_avx2(auVar74,auVar43);
            auVar43 = vpslld_avx2(auVar43,5);
            auVar74 = vpmulld_avx2(auVar74,auVar51);
            auVar43 = vpaddd_avx2(auVar43,auVar38);
            auVar43 = vpaddd_avx2(auVar74,auVar43);
            auVar43 = vpsrld_avx2(auVar43,5);
            auVar93._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar43._16_16_;
            auVar93._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar43 = vpackusdw_avx2(auVar43,auVar93);
          }
          uVar9 = -(uVar16 + 10);
          if (-0xb < (int)uVar16) {
            uVar9 = 0;
          }
          if ((int)uVar9 < 8) {
            uVar7 = (ulong)uVar9;
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 8),
                                  (undefined1  [16])HighbdLoadMaskx[uVar7]);
            auVar29 = vpshufb_avx(*(undefined1 (*) [16])(above + (long)(int)uVar16 + uVar7 + 9),
                                  (undefined1  [16])HighbdLoadMaskx[uVar7]);
            auVar74 = vpmovzxwd_avx2(auVar32);
            auVar47 = vpmovzxwd_avx2(auVar29);
            auVar47 = vpsubd_avx2(auVar47,auVar74);
            auVar74 = vpslld_avx2(auVar74,5);
            auVar47 = vpmulld_avx2(auVar47,auVar51);
            auVar74 = vpaddd_avx2(auVar74,auVar38);
            auVar74 = vpaddd_avx2(auVar47,auVar74);
            auVar74 = vpsrld_avx2(auVar74,5);
            auVar94._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar74._16_16_;
            auVar94._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar74 = vpackusdw_avx2(auVar74,auVar94);
            auVar32 = auVar74._0_16_;
          }
          auVar74 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if ((int)uVar16 < -1) {
            uVar11 = (undefined4)lVar10;
            auVar95._4_4_ = uVar11;
            auVar95._0_4_ = uVar11;
            auVar95._8_4_ = uVar11;
            auVar95._12_4_ = uVar11;
            auVar95._16_4_ = uVar11;
            auVar95._20_4_ = uVar11;
            auVar95._24_4_ = uVar11;
            auVar95._28_4_ = uVar11;
            auVar74 = vpor_avx2(auVar95,auVar55);
            auVar74 = vpmulld_avx2(auVar74,auVar28);
            auVar49 = vpsubd_avx2(auVar64,auVar74);
            auVar47 = vpsrad_avx2(auVar49,6);
            auVar74 = vpcmpgtd_avx2(auVar47,auVar33);
            auVar47 = vpand_avx2(auVar74,auVar47);
            auVar74 = vpaddd_avx2(auVar95,auVar70);
            auVar74 = vpmulld_avx2(auVar74,auVar28);
            auVar63 = vpsubd_avx2(auVar64,auVar74);
            auVar91 = vpsrad_avx2(auVar63,6);
            auVar74 = vpcmpgtd_avx2(auVar91,auVar33);
            auVar91 = vpand_avx2(auVar74,auVar91);
            auVar29 = vpinsrw_avx(ZEXT216(left[auVar47._0_4_]),(uint)left[auVar47._4_4_],1);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._8_4_],2);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._12_4_],3);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._16_4_],4);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._20_4_],5);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._24_4_],6);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar47._28_4_],7);
            auVar52 = vpinsrw_avx(ZEXT216(left[(long)auVar47._0_4_ + 1]),
                                  (uint)left[(long)auVar47._4_4_ + 1],1);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._8_4_ + 1],2);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._12_4_ + 1],3);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._16_4_ + 1],4);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._20_4_ + 1],5);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._24_4_ + 1],6);
            auVar50 = vpmovzxwd_avx2(auVar29);
            auVar29 = vpinsrw_avx(auVar52,(uint)left[(long)auVar47._28_4_ + 1],7);
            auVar47 = vpmovzxwd_avx2(auVar29);
            auVar74 = vpsrld_avx2(auVar49,1);
            auVar74 = vpand_avx2(auVar74,auVar35);
            auVar47 = vpsubd_avx2(auVar47,auVar50);
            auVar47 = vpmulld_avx2(auVar47,auVar74);
            auVar74 = vpslld_avx2(auVar50,5);
            auVar74 = vpaddd_avx2(auVar74,auVar38);
            auVar74 = vpaddd_avx2(auVar47,auVar74);
            auVar29 = vpinsrw_avx(ZEXT216(left[auVar91._0_4_]),(uint)left[auVar91._4_4_],1);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._8_4_],2);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._12_4_],3);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._16_4_],4);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._20_4_],5);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._24_4_],6);
            auVar29 = vpinsrw_avx(auVar29,(uint)left[auVar91._28_4_],7);
            auVar52 = vpinsrw_avx(ZEXT216(left[(long)auVar91._0_4_ + 1]),
                                  (uint)left[(long)auVar91._4_4_ + 1],1);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._8_4_ + 1],2);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._12_4_ + 1],3);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._16_4_ + 1],4);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._20_4_ + 1],5);
            auVar52 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._24_4_ + 1],6);
            auVar50 = vpmovzxwd_avx2(auVar29);
            auVar29 = vpinsrw_avx(auVar52,(uint)left[(long)auVar91._28_4_ + 1],7);
            auVar91 = vpmovzxwd_avx2(auVar29);
            auVar47 = vpsrld_avx2(auVar63,1);
            auVar47 = vpand_avx2(auVar47,auVar35);
            auVar91 = vpsubd_avx2(auVar91,auVar50);
            auVar91 = vpmulld_avx2(auVar91,auVar47);
            auVar47 = vpslld_avx2(auVar50,5);
            auVar47 = vpaddd_avx2(auVar47,auVar38);
            auVar47 = vpaddd_avx2(auVar91,auVar47);
            auVar91 = vperm2i128_avx2(auVar74,auVar47,0x31);
            auVar91 = vpsrld_avx2(auVar91,5);
            auVar96._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar74._0_16_;
            auVar96._16_16_ = ZEXT116(0) * auVar74._16_16_ + ZEXT116(1) * auVar47._0_16_;
            auVar74 = vpsrld_avx2(auVar96,5);
            auVar74 = vpackusdw_avx2(auVar74,auVar91);
          }
          auVar76._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar43._0_16_;
          auVar76._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar32;
          auVar43 = vpblendvb_avx2(auVar76,auVar74,(undefined1  [32])HighbdBaseMask[uVar22]);
          *(undefined1 (*) [32])((long)local_70 + lVar10 * 2) = auVar43;
          lVar10 = lVar10 + 0x10;
          iVar5 = iVar5 + 0x400;
        } while (lVar10 < bw);
      }
      iVar20 = iVar20 + 1;
      local_70 = (undefined1 (*) [16])((long)local_70 + stride * 2);
      iVar8 = iVar8 - dx;
    } while (iVar20 != bh);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int upsample_left, int dx, int dy,
                                      int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx4_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx4_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    case 8:
      if (bd < 12) {
        highbd_dr_prediction_z2_Nx8_avx2(bh, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_Nx8_avx2(bh, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
    default:
      if (bd < 12) {
        highbd_dr_prediction_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                         upsample_above, upsample_left, dx, dy);
      } else {
        highbd_dr_prediction_32bit_z2_HxW_avx2(bh, bw, dst, stride, above, left,
                                               upsample_above, upsample_left,
                                               dx, dy);
      }
      break;
  }
}